

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarEnv.cpp
# Opt level: O3

void __thiscall VarEnv::assignVar(VarEnv *this,string *name,Data *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>
  local_50;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>_>
                  *)this,name);
  Data::cite(data);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->vars)._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_50.first.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_50.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
    local_50.second = data;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Data*>,std::_Select1st<std::pair<std::__cxx11::string_const,Data*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Data*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Data*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Data*>,std::_Select1st<std::pair<std::__cxx11::string_const,Data*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Data*>>>
                *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.first._M_dataplus._M_p);
    }
  }
  else {
    Data::uncite(*(Data **)(iVar3._M_node + 2));
    Data::check(*(Data **)(iVar3._M_node + 2));
    *(Data **)(iVar3._M_node + 2) = data;
  }
  return;
}

Assistant:

void VarEnv::assignVar(const std::string &name, Data *data) {
    auto search = vars.find(name);
    data->cite();
    if (search != vars.end()) {
        (search->second)->uncite();
        Data::check(search->second);
        search->second = data;
    } else {
        vars.insert(std::pair<std::string, Data *>(name, data));
    }
}